

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<4,_7,_7>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int i;
  long lVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  Vector<float,_3> res;
  undefined8 local_28;
  float local_20 [4];
  undefined8 local_10;
  float local_8;
  
  fVar1 = evalCtx->in[1].m_data[1];
  fVar2 = evalCtx->in[1].m_data[2];
  fVar3 = evalCtx->in[1].m_data[3];
  fVar5 = fVar1;
  fVar6 = fVar2;
  fVar7 = fVar3;
  if (in0Type != INPUTTYPE_DYNAMIC) {
    fVar5 = -0.6;
    fVar6 = -0.6;
    fVar7 = -0.1;
  }
  fVar11 = evalCtx->in[0].m_data[0];
  fVar12 = evalCtx->in[0].m_data[1];
  fVar13 = evalCtx->in[0].m_data[2];
  fVar10 = fVar13;
  fVar8 = fVar11;
  fVar9 = fVar12;
  if (in0Type != INPUTTYPE_DYNAMIC) {
    fVar8 = -0.6;
    fVar9 = -0.6;
    fVar10 = -0.2;
  }
  if (in1Type != INPUTTYPE_DYNAMIC) {
    fVar1 = -1.0;
    fVar2 = 0.7;
    fVar3 = -0.3;
    fVar11 = -1.2;
    fVar12 = 0.7;
    fVar13 = 0.7;
  }
  local_28 = CONCAT44(fVar9 * fVar12,fVar8 * fVar11);
  local_20[0] = fVar10 * fVar13;
  local_10 = CONCAT44(fVar6 * fVar2,fVar5 * fVar1);
  local_8 = fVar7 * fVar3;
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  res.m_data[2] = 0.0;
  lVar4 = 0;
  do {
    res.m_data[lVar4] =
         *(float *)((long)&local_28 + lVar4 * 4) + *(float *)((long)&local_10 + lVar4 * 4);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_20[0] = 0.0;
  local_20[1] = 1.4013e-45;
  local_20[2] = 2.8026e-45;
  lVar4 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_28 + lVar4 * 4)] = res.m_data[lVar4 + -2];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(matrixCompMult(in0, in1));
	}